

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.cc
# Opt level: O1

void __thiscall re2c::DFA::~DFA(DFA *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Skeleton *this_00;
  pointer pcVar2;
  pointer ppSVar3;
  State *this_01;
  
  this_01 = this->head;
  while (this_01 != (State *)0x0) {
    this->head = this_01->next;
    State::~State(this_01);
    operator_delete(this_01,0x58);
    this_01 = this->head;
  }
  this_00 = this->skeleton;
  if (this_00 != (Skeleton *)0x0) {
    Skeleton::~Skeleton(this_00);
    operator_delete(this_00,0x90);
  }
  pcVar2 = (this->cond)._M_dataplus._M_p;
  paVar1 = &(this->cond).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppSVar3 = (this->accepts).elems.
            super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar3 != (pointer)0x0) {
    operator_delete(ppSVar3,(long)(this->accepts).elems.
                                  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar3
                   );
    return;
  }
  return;
}

Assistant:

DFA::~DFA()
{
	State *s;

	while ((s = head))
	{
		head = s->next;
		delete s;
	}

	delete skeleton;
}